

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.cpp
# Opt level: O2

void __thiscall Lodtalk::AST::MethodAST::~MethodAST(MethodAST *this)

{
  (this->super_FunctionalNode).super_Node._vptr_Node = (_func_int **)&PTR__MethodAST_00170220;
  if (this->header != (MethodHeader *)0x0) {
    (*(this->header->super_Node)._vptr_Node[1])();
  }
  if (this->pragmaList != (PragmaList *)0x0) {
    (*(this->pragmaList->super_Node)._vptr_Node[1])();
  }
  if (this->body != (SequenceNode *)0x0) {
    (*(this->body->super_Node)._vptr_Node[1])();
  }
  OopRef::~OopRef(&(this->astHandle).reference);
  FunctionalNode::~FunctionalNode(&this->super_FunctionalNode);
  return;
}

Assistant:

MethodAST::~MethodAST()
{
	delete header;
    delete pragmaList;
	delete body;
}